

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedApiCase::renderTo(MixedApiCase *this,Surface *dst)

{
  RenderContext *context;
  GLuint GVar1;
  int iVar2;
  GLuint attribindex;
  GLuint attribindex_00;
  GLenum GVar3;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  void *data;
  CallLogWrapper gl;
  Buffer dummyBuffer;
  CallLogWrapper local_90;
  TextureFormat local_78;
  ObjectWrapper local_70;
  PixelBufferAccess local_58;
  
  iVar2 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_90,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log);
  attribindex = glu::CallLogWrapper::glGetAttribLocation
                          (&local_90,
                           (((this->super_BindingRenderCase).m_program)->m_program).m_program,
                           "a_position");
  attribindex_00 =
       glu::CallLogWrapper::glGetAttribLocation
                 (&local_90,(((this->super_BindingRenderCase).m_program)->m_program).m_program,
                  "a_color");
  iVar2 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_70,(Functions *)CONCAT44(extraout_var_00,iVar2),traits);
  local_90.m_enableLog = true;
  glu::CallLogWrapper::glClearColor(&local_90,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear(&local_90,0x4000);
  glu::CallLogWrapper::glViewport(&local_90,0,0,dst->m_width,dst->m_height);
  glu::CallLogWrapper::glBindVertexArray(&local_90,(this->super_BindingRenderCase).m_vao);
  GVar3 = glu::CallLogWrapper::glGetError(&local_90);
  glu::checkError(GVar3,"set vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x471);
  glu::CallLogWrapper::glUseProgram
            (&local_90,(((this->super_BindingRenderCase).m_program)->m_program).m_program);
  GVar3 = glu::CallLogWrapper::glGetError(&local_90);
  glu::checkError(GVar3,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x474);
  switch(this->m_case) {
  case CASE_CHANGE_BUFFER:
    glu::CallLogWrapper::glBindBuffer(&local_90,0x8892,local_70.m_object);
    glu::CallLogWrapper::glVertexAttribPointer(&local_90,attribindex,4,0x1406,'\0',0x20,(void *)0x0)
    ;
    glu::CallLogWrapper::glVertexAttribPointer
              (&local_90,attribindex_00,4,0x1406,'\0',0x20,(void *)0x10);
    glu::CallLogWrapper::glBindVertexBuffer(&local_90,attribindex,this->m_buffer,0,0x20);
    glu::CallLogWrapper::glBindVertexBuffer(&local_90,attribindex_00,this->m_buffer,0x10,0x20);
    err = glu::CallLogWrapper::glGetError(&local_90);
    iVar2 = 0x485;
    break;
  case CASE_CHANGE_BUFFER_OFFSET:
    glu::CallLogWrapper::glBindBuffer(&local_90,0x8892,this->m_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(&local_90,attribindex,4,0x1406,'\0',0x20,(void *)0x0)
    ;
    glu::CallLogWrapper::glVertexAttribPointer
              (&local_90,attribindex_00,4,0x1406,'\0',0x20,(void *)0x0);
    glu::CallLogWrapper::glBindVertexBuffer(&local_90,attribindex,this->m_buffer,0,0x20);
    glu::CallLogWrapper::glBindVertexBuffer(&local_90,attribindex_00,this->m_buffer,0x10,0x20);
    err = glu::CallLogWrapper::glGetError(&local_90);
    iVar2 = 0x496;
    break;
  case CASE_CHANGE_BUFFER_STRIDE:
    glu::CallLogWrapper::glBindBuffer(&local_90,0x8892,this->m_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(&local_90,attribindex,4,0x1406,'\0',8,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer(&local_90,attribindex_00,4,0x1406,'\0',4,(void *)0x0)
    ;
    glu::CallLogWrapper::glBindVertexBuffer(&local_90,attribindex,this->m_buffer,0,0x20);
    glu::CallLogWrapper::glBindVertexBuffer(&local_90,attribindex_00,this->m_buffer,0x10,0x20);
    err = glu::CallLogWrapper::glGetError(&local_90);
    iVar2 = 0x4a7;
    break;
  case CASE_CHANGE_BINDING_POINT:
    GVar1 = attribindex_00;
    if ((int)attribindex_00 < (int)attribindex) {
      GVar1 = attribindex;
    }
    glu::CallLogWrapper::glBindBuffer(&local_90,0x8892,this->m_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(&local_90,GVar1 + 1,4,0x1406,'\0',0x20,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer(&local_90,GVar1 + 2,4,0x1406,'\0',0x20,(void *)0x10);
    glu::CallLogWrapper::glVertexAttribFormat(&local_90,attribindex,4,0x1406,'\0',0);
    glu::CallLogWrapper::glVertexAttribFormat(&local_90,attribindex_00,4,0x1406,'\0',0);
    glu::CallLogWrapper::glVertexAttribBinding(&local_90,attribindex,GVar1 + 1);
    glu::CallLogWrapper::glVertexAttribBinding(&local_90,attribindex_00,GVar1 + 2);
    GVar3 = glu::CallLogWrapper::glGetError(&local_90);
    glu::checkError(GVar3,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x4bf);
  default:
    goto switchD_01564849_default;
  }
  glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,iVar2);
switchD_01564849_default:
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_90,attribindex);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_90,attribindex_00);
  glu::CallLogWrapper::glDrawArrays(&local_90,4,0,0x960);
  glu::CallLogWrapper::glFinish(&local_90);
  glu::CallLogWrapper::glBindVertexArray(&local_90,0);
  glu::CallLogWrapper::glUseProgram(&local_90,0);
  GVar3 = glu::CallLogWrapper::glGetError(&local_90);
  glu::checkError(GVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x4cf);
  context = ((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  local_78.order = RGBA;
  local_78.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_58,&local_78,dst->m_width,dst->m_height,1,data);
  glu::readPixels(context,0,0,&local_58);
  glu::ObjectWrapper::~ObjectWrapper(&local_70);
  glu::CallLogWrapper::~CallLogWrapper(&local_90);
  return;
}

Assistant:

void MixedApiCase::renderTo (tcu::Surface& dst)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const int				positionLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	const int				colorLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_color");
	glu::Buffer				dummyBuffer		(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	gl.glViewport(0, 0, dst.getWidth(), dst.getHeight());
	gl.glBindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set vao");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	switch (m_case)
	{
		case CASE_CHANGE_BUFFER:
		{
			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, *dummyBuffer);
			gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(colorLoc,    4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL + sizeof(tcu::Vec4));

			// change buffer with vertex_attrib_binding

			gl.glBindVertexBuffer(positionLoc, m_buffer, 0,                 (glw::GLsizei)(2 * sizeof(tcu::Vec4)));
			gl.glBindVertexBuffer(colorLoc,    m_buffer, sizeof(tcu::Vec4), (glw::GLsizei)(2 * sizeof(tcu::Vec4)));

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		case CASE_CHANGE_BUFFER_OFFSET:
		{
			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
			gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(colorLoc,    4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);

			// change buffer offset with vertex_attrib_binding

			gl.glBindVertexBuffer(positionLoc, m_buffer, 0,                 (glw::GLsizei)(2 * sizeof(tcu::Vec4)));
			gl.glBindVertexBuffer(colorLoc,    m_buffer, sizeof(tcu::Vec4), (glw::GLsizei)(2 * sizeof(tcu::Vec4)));

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		case CASE_CHANGE_BUFFER_STRIDE:
		{
			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
			gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 8, (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(colorLoc,    4, GL_FLOAT, GL_FALSE, 4, (const deUint8*)DE_NULL);

			// change buffer stride with vertex_attrib_binding

			gl.glBindVertexBuffer(positionLoc, m_buffer, 0,                 (glw::GLsizei)(2 * sizeof(tcu::Vec4)));
			gl.glBindVertexBuffer(colorLoc,    m_buffer, sizeof(tcu::Vec4), (glw::GLsizei)(2 * sizeof(tcu::Vec4)));

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		case CASE_CHANGE_BINDING_POINT:
		{
			const int maxUsedLocation	= de::max(positionLoc, colorLoc);
			const int bindingPoint1		= maxUsedLocation + 1;
			const int bindingPoint2		= maxUsedLocation + 2;

			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
			gl.glVertexAttribPointer(bindingPoint1, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(bindingPoint2, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL + sizeof(tcu::Vec4));

			// change buffer binding point with vertex_attrib_binding

			gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, 0);
			gl.glVertexAttribFormat(colorLoc, 4, GL_FLOAT, GL_FALSE, 0);

			gl.glVertexAttribBinding(positionLoc, bindingPoint1);
			gl.glVertexAttribBinding(colorLoc, bindingPoint2);

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// draw
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glEnableVertexAttribArray(colorLoc);
	gl.glDrawArrays(GL_TRIANGLES, 0, 6*GRID_SIZE*GRID_SIZE);

	gl.glFinish();
	gl.glBindVertexArray(0);
	gl.glUseProgram(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}